

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedBodyInertia.cpp
# Opt level: O0

Matrix6x6 * __thiscall iDynTree::ArticulatedBodyInertia::asMatrix(ArticulatedBodyInertia *this)

{
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *this_00;
  Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *in_RSI;
  Stride<0,_0> *in_RDI;
  Matrix6x6 *retMat;
  Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> retMatEigen;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe88;
  Stride<0,_0> *this_01;
  
  this_01 = in_RDI;
  MatrixFixSize<6U,_6U>::MatrixFixSize((MatrixFixSize<6U,_6U> *)in_RDI);
  this_00 = (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
             *)MatrixFixSize<6U,_6U>::data((MatrixFixSize<6U,_6U> *)in_RDI);
  Eigen::Stride<0,_0>::Stride(in_RDI);
  Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_RSI,(PointerArgType)this_00,in_RDI);
  toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)this_01);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::block<3,3>
            ((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
              *)this_01,(Index)in_RSI,(Index)this_00);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
             *)in_RDI,in_stack_fffffffffffffe88);
  toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)this_01);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::block<3,3>
            ((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
              *)this_01,(Index)in_RSI,(Index)this_00);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
             *)in_RDI,in_stack_fffffffffffffe88);
  toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)this_01);
  Eigen::DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose(this_00);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::block<3,3>
            ((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
              *)this_01,(Index)in_RSI,(Index)this_00);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
             *)in_RDI,
            (DenseBase<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>_>
             *)in_stack_fffffffffffffe88);
  toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)this_01);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::block<3,3>
            ((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
              *)this_01,(Index)in_RSI,(Index)this_00);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
             *)in_RDI,in_stack_fffffffffffffe88);
  return (Matrix6x6 *)this_01;
}

Assistant:

Matrix6x6 ArticulatedBodyInertia::asMatrix() const
{
    Matrix6x6 retMat;

    Eigen::Map<Matrix6dRowMajor> retMatEigen(retMat.data());

    retMatEigen.block<3,3>(0,0) = toEigen(linearLinear);
    retMatEigen.block<3,3>(0,3) = toEigen(linearAngular);
    retMatEigen.block<3,3>(3,0) = toEigen(linearAngular).transpose();
    retMatEigen.block<3,3>(3,3) = toEigen(angularAngular);

    return retMat;
}